

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

void read_request(void)

{
  FILE *fp;
  X509_REQ *pXVar1;
  FILE *reqfile;
  
  if (r_flag != 0) {
    fp = fopen(r_char,"r");
    if (fp != (FILE *)0x0) {
      pXVar1 = PEM_read_X509_REQ(fp,(X509_REQ **)&request,(undefined1 *)0x0,(void *)0x0);
      if (pXVar1 == (X509_REQ *)0x0) {
        fprintf(_stderr,"%s: error while reading request file\n",pname);
        ERR_print_errors_fp(_stderr);
        exit(0x5d);
      }
      fclose(fp);
      return;
    }
  }
  fprintf(_stderr,"%s: cannot open certificate request\n",pname);
  exit(0x5d);
}

Assistant:

void
read_request(void) {
	FILE *reqfile;

	/* Read certificate request file */
	if (!r_flag || 
#ifdef WIN32
		(fopen_s(&reqfile, r_char, "r")))
#else
		!(reqfile = fopen(r_char, "r")))
#endif
	{
		fprintf(stderr, "%s: cannot open certificate request\n", pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (!PEM_read_X509_REQ(reqfile, &request, NULL, NULL)) {
		fprintf(stderr, "%s: error while reading request file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	fclose(reqfile);
}